

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

int * Cba_VecLoadFanins(Cba_Ntk_t *p,Vec_Int_t *vOut,int iFon,int *pFanins,int nFanins,int nTotal,
                       int fSigned)

{
  int *piVar1;
  ulong uVar2;
  int Entry;
  int iVar3;
  
  if (nTotal < nFanins) {
    __assert_fail("nFanins <= nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x79,
                  "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)");
  }
  if (iFon < 1) {
    if (iFon < 0) {
      Cba_BlastConst(p,vOut,iFon,nTotal,fSigned);
    }
    else {
      if (iFon != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                      ,0x85,
                      "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)")
        ;
      }
      if (vOut->nCap < nTotal) {
        if (vOut->pArray == (int *)0x0) {
          piVar1 = (int *)malloc((long)nTotal << 2);
        }
        else {
          piVar1 = (int *)realloc(vOut->pArray,(long)nTotal << 2);
        }
        vOut->pArray = piVar1;
        if (piVar1 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vOut->nCap = nTotal;
      }
      if (0 < nTotal) {
        memset(vOut->pArray,0,(ulong)(uint)nTotal << 2);
      }
      vOut->nSize = nTotal;
    }
  }
  else {
    if (fSigned == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = pFanins[(long)nFanins + -1];
    }
    vOut->nSize = 0;
    if (0 < nTotal) {
      uVar2 = 0;
      do {
        Entry = iVar3;
        if ((long)uVar2 < (long)nFanins) {
          Entry = pFanins[uVar2];
        }
        Vec_IntPush(vOut,Entry);
        uVar2 = uVar2 + 1;
      } while ((uint)nTotal != uVar2);
    }
  }
  if (vOut->nSize != nTotal) {
    __assert_fail("Vec_IntSize(vOut) == nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x86,
                  "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)");
  }
  return vOut->pArray;
}

Assistant:

int * Cba_VecLoadFanins( Cba_Ntk_t * p, Vec_Int_t * vOut, int iFon, int * pFanins, int nFanins, int nTotal, int fSigned )
{
    assert( nFanins <= nTotal );
    if ( Cba_FonIsReal(iFon) )
    {
        int i, Fill = fSigned ? pFanins[nFanins-1] : 0;
        Vec_IntClear( vOut );
        for( i = 0; i < nTotal; i++) 
            Vec_IntPush( vOut, i < nFanins ? pFanins[i] : Fill );
    }
    else if ( Cba_FonIsConst(iFon) )
        Cba_BlastConst( p, vOut, iFon, nTotal, fSigned );
    else if ( iFon == 0 ) // undriven input
        Vec_IntFill( vOut, nTotal, 0 );
    else assert( 0 );
    assert( Vec_IntSize(vOut) == nTotal );
    return Vec_IntArray( vOut );
}